

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O3

bool __thiscall QJsonPrivate::Parser::parseString(Parser *this)

{
  byte bVar1;
  int iVar2;
  uchar *uend;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  byte *pbVar7;
  qsizetype len;
  bool bVar8;
  byte *pbVar9;
  char16_t *data;
  QFlagsStorage<QtCbor::Element::ValueFlag> extraFlags;
  long in_FS_OFFSET;
  QString local_58;
  uint local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar9 = (byte *)this->json;
  pbVar3 = (byte *)this->end;
  bVar8 = true;
  pbVar7 = pbVar9;
  while ((pbVar7 < pbVar3 && (bVar1 = *pbVar7, bVar1 != 0x22))) {
    if (bVar1 == 0x5c) {
      this->json = (char *)(pbVar7 + 1);
      if (pbVar3 < pbVar7 + 1) goto LAB_00115b4c;
      this->json = (char *)pbVar9;
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char16_t *)0x0;
      local_58.d.size = 0;
      if (pbVar3 <= pbVar9) goto LAB_00115e4e;
      goto LAB_00115be0;
    }
    pbVar7 = pbVar7 + 1;
    if ((char)bVar1 < '\0') {
      this->lastError = IllegalUTF8String;
      goto LAB_00115b53;
    }
    this->json = (char *)pbVar7;
    bVar8 = (bool)(bVar8 & bVar1 < 0x80);
  }
  pbVar7 = pbVar7 + 1;
  this->json = (char *)pbVar7;
  if (pbVar3 < pbVar7) {
LAB_00115b4c:
    this->lastError = UnterminatedString;
LAB_00115b53:
    bVar8 = false;
  }
  else {
    if (bVar8) {
      extraFlags.i = 8;
    }
    else {
      extraFlags.i = 0;
    }
    QCborContainerPrivate::appendByteData
              ((this->container).d.ptr,(char *)pbVar9,(qsizetype)(pbVar7 + ~(ulong)pbVar9),String,
               (ValueFlags)extraFlags.i);
    bVar8 = true;
  }
  goto LAB_00115b85;
LAB_00115be0:
  do {
    bVar1 = *pbVar9;
    uVar4 = (uint)bVar1;
    if (bVar1 == 0x5c) {
      this->json = (char *)(pbVar9 + 1);
      if (pbVar3 <= pbVar9 + 1) {
LAB_00115e94:
        this->lastError = IllegalEscapeSequence;
        goto LAB_00115ea4;
      }
      this->json = (char *)(pbVar9 + 2);
      bVar1 = pbVar9[1];
      uVar4 = (uint)bVar1;
      if (bVar1 < 0x62) {
        if (bVar1 != 0x22) {
          if (bVar1 == 0x2f) {
            uVar4 = 0x2f;
          }
          else if (bVar1 == 0x5c) {
            uVar4 = 0x5c;
          }
        }
      }
      else {
        switch(bVar1) {
        case 0x6e:
          uVar4 = 10;
          break;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x73:
          break;
        case 0x72:
          uVar4 = 0xd;
          break;
        case 0x74:
          uVar4 = 9;
          break;
        case 0x75:
          if (pbVar9 + 2 <= pbVar3 + -4) {
            pbVar9 = pbVar9 + 3;
            uVar4 = 0;
            iVar2 = 4;
            do {
              iVar5 = (int)(char)pbVar9[-1];
              uVar6 = iVar5 - 0x30;
              if (9 < uVar6) {
                if (iVar5 - 0x41U < 6) {
                  uVar6 = iVar5 - 0x37;
                }
                else {
                  if (5 < iVar5 - 0x61U) goto LAB_00115e94;
                  uVar6 = iVar5 - 0x57;
                }
              }
              uVar4 = uVar4 << 4 | uVar6;
              this->json = (char *)pbVar9;
              pbVar9 = pbVar9 + 1;
              iVar2 = iVar2 + -1;
            } while (iVar2 != 0);
            goto LAB_00115d89;
          }
          goto LAB_00115e94;
        default:
          if (bVar1 == 0x62) {
            uVar4 = 8;
          }
          else if (bVar1 == 0x66) {
            uVar4 = 0xc;
          }
        }
      }
      len = 1;
    }
    else {
      if (bVar1 == 0x22) break;
      if ((char)bVar1 < '\0') {
        this->lastError = IllegalUTF8String;
        goto LAB_00115ea4;
      }
      this->json = (char *)(pbVar9 + 1);
LAB_00115d89:
      len = 1;
      if (0xffff < uVar4) {
        uVar4 = (uVar4 & 0x3ff) * 0x10000 + ((uVar4 >> 10) + 0xd7c0 & 0xffff) + 0xdc000000;
        len = 2;
      }
    }
    local_34 = uVar4;
    QString::append(&local_58,(QChar *)&local_34,len);
    pbVar9 = (byte *)this->json;
    pbVar3 = (byte *)this->end;
  } while (pbVar9 < pbVar3);
LAB_00115e4e:
  this->json = (char *)(pbVar9 + 1);
  if (pbVar3 < pbVar9 + 1) {
    this->lastError = UnterminatedString;
LAB_00115ea4:
    bVar8 = false;
  }
  else {
    data = local_58.d.ptr;
    if (local_58.d.ptr == (char16_t *)0x0) {
      data = L"";
    }
    QCborContainerPrivate::appendByteData
              ((this->container).d.ptr,(char *)data,local_58.d.size * 2,String,(ValueFlags)0x4);
    bVar8 = true;
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00115b85:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool Parser::parseString()
{
    const char *start = json;

    // try to parse a utf-8 string without escape sequences, and note whether it's 7bit ASCII.

    bool isUtf8 = true;
    bool isAscii = true;
    while (json < end) {
        char32_t ch = 0;
        if (*json == '"')
            break;
        if (*json == '\\') {
            isAscii = false;
            // If we find escape sequences, we store UTF-16 as there are some
            // escape sequences which are hard to represent in UTF-8.
            // (plain "\\ud800" for example)
            isUtf8 = false;
            break;
        }
        if (!scanUtf8Char(json, end, &ch)) {
            lastError = QJsonParseError::IllegalUTF8String;
            return false;
        }
        if (ch > 0x7f)
            isAscii = false;
    }
    ++json;
    if (json > end) {
        lastError = QJsonParseError::UnterminatedString;
        return false;
    }

    // no escape sequences, we are done
    if (isUtf8) {
        if (isAscii)
            container->appendAsciiString(start, json - start - 1);
        else
            container->appendUtf8String(start, json - start - 1);
        return true;
    }

    json = start;

    QString ucs4;
    while (json < end) {
        char32_t ch = 0;
        if (*json == '"')
            break;
        else if (*json == '\\') {
            if (!scanEscapeSequence(json, end, &ch)) {
                lastError = QJsonParseError::IllegalEscapeSequence;
                return false;
            }
        } else {
            if (!scanUtf8Char(json, end, &ch)) {
                lastError = QJsonParseError::IllegalUTF8String;
                return false;
            }
        }
        ucs4.append(QChar::fromUcs4(ch));
    }
    ++json;

    if (json > end) {
        lastError = QJsonParseError::UnterminatedString;
        return false;
    }

    container->appendByteData(reinterpret_cast<const char *>(ucs4.constData()), ucs4.size() * 2,
                              QCborValue::String, QtCbor::Element::StringIsUtf16);
    return true;
}